

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression * new_ir_constfloat(Context_conflict *ctx,float val)

{
  MOJOSHADER_irConstant *retval;
  float val_local;
  Context_conflict *ctx_local;
  
  ctx_local = (Context_conflict *)Malloc(ctx,0x60);
  if (ctx_local == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx_local->isfail = 1;
    ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
    *(uint *)&ctx_local->free = ctx->sourceline;
    *(undefined4 *)&ctx_local->malloc_data = 4;
    *(undefined4 *)((long)&ctx_local->malloc_data + 4) = 1;
    *(float *)&ctx_local->errors = val;
  }
  return (MOJOSHADER_irExpression *)ctx_local;
}

Assistant:

static MOJOSHADER_irExpression *new_ir_constfloat(Context *ctx, const float val)
{
    NEW_IR_EXPR(retval, MOJOSHADER_irConstant, MOJOSHADER_IR_CONSTANT, MOJOSHADER_AST_DATATYPE_FLOAT, 1);
    retval->value.fval[0] = val;
    return (MOJOSHADER_irExpression *) retval;
}